

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderLocator(void *ctx,char **file,unsigned_long *line)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  unsigned_long uVar4;
  int iVar5;
  int iVar6;
  
  iVar3 = -1;
  iVar5 = iVar3;
  if ((ctx != (void *)0x0) && (file != (char **)0x0 || line != (unsigned_long *)0x0)) {
    if (file != (char **)0x0) {
      *file = (char *)0x0;
    }
    if (line != (unsigned_long *)0x0) {
      *line = 0;
    }
    if ((*(long *)((long)ctx + 0x20) == 0) ||
       (lVar1 = *(long *)(*(long *)((long)ctx + 0x20) + 0x38), lVar1 == 0)) {
      if (*(xmlNode **)((long)ctx + 0x70) != (xmlNode *)0x0) {
        iVar6 = 0;
        if (line != (unsigned_long *)0x0) {
          uVar4 = xmlGetLineNo(*(xmlNode **)((long)ctx + 0x70));
          if ((long)uVar4 < 1) {
            iVar6 = -1;
          }
          else {
            *line = uVar4;
          }
        }
        iVar5 = iVar6;
        if (((file != (char **)0x0) &&
            (lVar1 = *(long *)(*(long *)((long)ctx + 0x70) + 0x40), iVar5 = iVar3, lVar1 != 0)) &&
           (pcVar2 = *(char **)(lVar1 + 0x88), pcVar2 != (char *)0x0)) {
          *file = pcVar2;
          iVar5 = iVar6;
        }
      }
    }
    else {
      if (file != (char **)0x0) {
        *file = *(char **)(lVar1 + 8);
      }
      iVar5 = 0;
      if (line != (unsigned_long *)0x0) {
        *line = (long)*(int *)(*(long *)(*(long *)((long)ctx + 0x20) + 0x38) + 0x34);
      }
    }
  }
  return iVar5;
}

Assistant:

static int
xmlTextReaderLocator(void *ctx, const char **file, unsigned long *line) {
    xmlTextReaderPtr reader;

    if ((ctx == NULL) || ((file == NULL) && (line == NULL)))
        return(-1);

    if (file != NULL)
        *file = NULL;
    if (line != NULL)
        *line = 0;

    reader = (xmlTextReaderPtr) ctx;
    if ((reader->ctxt != NULL) && (reader->ctxt->input != NULL)) {
	if (file != NULL)
	    *file = reader->ctxt->input->filename;
	if (line != NULL)
	    *line = reader->ctxt->input->line;
	return(0);
    }
    if (reader->node != NULL) {
        long res;
	int ret = 0;

	if (line != NULL) {
	    res = xmlGetLineNo(reader->node);
	    if (res > 0)
	        *line = (unsigned long) res;
	    else
                ret = -1;
	}
        if (file != NULL) {
	    xmlDocPtr doc = reader->node->doc;
	    if ((doc != NULL) && (doc->URL != NULL))
	        *file = (const char *) doc->URL;
	    else
                ret = -1;
	}
	return(ret);
    }
    return(-1);
}